

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int amqp_try_recv(amqp_connection_state_t state)

{
  amqp_time_t timeout_00;
  int iVar1;
  amqp_pool_t *pool;
  undefined8 *puVar2;
  amqp_link_t *paVar3;
  amqp_link_t *paVar4;
  amqp_time_t timeout;
  anon_union_40_4_bc673bb6_for_payload aStack_70;
  timeval local_48;
  
  while( true ) {
    do {
      if (state->sock_inbound_limit <= state->sock_inbound_offset) {
        local_48.tv_sec = 0;
        local_48.tv_usec = 0;
        iVar1 = amqp_time_from_now(&timeout,&local_48);
        if (iVar1 == 0) {
          timeout_00.time_point_ns._1_1_ = timeout.time_point_ns._1_1_;
          timeout_00.time_point_ns._0_1_ = (char)timeout.time_point_ns;
          timeout_00.time_point_ns._2_2_ = timeout.time_point_ns._2_2_;
          timeout_00.time_point_ns._4_4_ = timeout.time_point_ns._4_4_;
          iVar1 = recv_with_timeout(state,timeout_00);
        }
        return iVar1;
      }
      iVar1 = consume_one_frame(state,(amqp_frame_t *)&timeout);
      if (iVar1 != 0) {
        return iVar1;
      }
    } while ((char)timeout.time_point_ns == '\0');
    pool = amqp_get_or_create_channel_pool(state,timeout.time_point_ns._2_2_);
    if (pool == (amqp_pool_t *)0x0) {
      return -1;
    }
    puVar2 = (undefined8 *)amqp_pool_alloc(pool,0x30);
    paVar3 = (amqp_link_t *)amqp_pool_alloc(pool,0x10);
    if (puVar2 == (undefined8 *)0x0) break;
    if (paVar3 == (amqp_link_t *)0x0) {
      return -1;
    }
    puVar2[4] = aStack_70.properties.raw.len;
    puVar2[5] = aStack_70.properties.raw.bytes;
    puVar2[2] = aStack_70.method.decoded;
    puVar2[3] = aStack_70.properties.decoded;
    *puVar2 = CONCAT44(timeout.time_point_ns._4_4_,
                       CONCAT22(timeout.time_point_ns._2_2_,
                                CONCAT11(timeout.time_point_ns._1_1_,(char)timeout.time_point_ns)));
    puVar2[1] = aStack_70.body_fragment.len;
    paVar3->next = (amqp_link_t_ *)0x0;
    paVar3->data = puVar2;
    paVar4 = state->last_queued_frame;
    if (state->last_queued_frame == (amqp_link_t *)0x0) {
      paVar4 = (amqp_link_t *)&state->first_queued_frame;
    }
    paVar4->next = paVar3;
    state->last_queued_frame = paVar3;
  }
  return -1;
}

Assistant:

int amqp_try_recv(amqp_connection_state_t state) {
  amqp_time_t timeout;
  int res;

  while (amqp_data_in_buffer(state)) {
    amqp_frame_t frame;
    res = consume_one_frame(state, &frame);

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (frame.frame_type != 0) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;
    }
  }
  res = amqp_time_from_now(&timeout, &(struct timeval){0});
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  return recv_with_timeout(state, timeout);
}